

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O2

int ws_listener_listen(void *arg)

{
  nng_err nVar1;
  nni_http_server *s;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  if (*(char *)((long)arg + 0x111) == '\0') {
    if (*(char *)((long)arg + 0x110) == '\0') {
      nVar1 = nni_http_server_add_handler
                        (*(nni_http_server **)((long)arg + 0x50),
                         *(nni_http_handler **)((long)arg + 0x118));
      s = *(nni_http_server **)((long)arg + 0x50);
      if (nVar1 == NNG_OK) {
        nVar1 = nni_http_server_start(s);
        if (nVar1 == NNG_OK) {
          *(undefined1 *)((long)arg + 0x110) = 1;
          nVar1 = NNG_OK;
          goto LAB_00130761;
        }
        nni_http_server_del_handler
                  (*(nni_http_server **)((long)arg + 0x50),*(nni_http_handler **)((long)arg + 0x118)
                  );
        s = *(nni_http_server **)((long)arg + 0x50);
      }
      nni_http_server_fini(s);
      *(undefined8 *)((long)arg + 0x50) = 0;
    }
    else {
      nVar1 = NNG_ESTATE;
    }
  }
  else {
    nVar1 = NNG_ECLOSED;
  }
LAB_00130761:
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  return nVar1;
}

Assistant:

static int
ws_listener_listen(void *arg)
{
	nni_ws_listener *l = arg;
	int              rv;

	nni_mtx_lock(&l->mtx);
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ECLOSED);
	}
	if (l->started) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ESTATE);
	}

	if ((rv = nni_http_server_add_handler(l->server, l->handler)) != 0) {
		nni_http_server_fini(l->server);
		l->server = NULL;
		nni_mtx_unlock(&l->mtx);
		return (rv);
	}

	if ((rv = nni_http_server_start(l->server)) != 0) {
		nni_http_server_del_handler(l->server, l->handler);
		nni_http_server_fini(l->server);
		l->server = NULL;
		nni_mtx_unlock(&l->mtx);
		return (rv);
	}

	l->started = true;

	nni_mtx_unlock(&l->mtx);
	return (0);
}